

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::
DeserializeDecimalArithmetic<duckdb::SubtractOperator,duckdb::DecimalSubtractOverflowCheck,false>
          (duckdb *this,Deserializer *deserializer,ScalarFunction *bound_function)

{
  bool bVar1;
  pointer pDVar2;
  _Any_data local_70 [2];
  LogicalType return_type;
  vector<duckdb::LogicalType,_true> arguments;
  
  bVar1 = Deserializer::ReadProperty<bool>(deserializer,100,"check_overflow");
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,0x65,"return_type");
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (&arguments,deserializer,0x66,"arguments");
  if (bVar1) {
    GetScalarBinaryFunction<duckdb::DecimalSubtractOverflowCheck>
              ((scalar_function_t *)local_70,return_type.physical_type_);
  }
  else {
    GetScalarBinaryFunction<duckdb::SubtractOperator>
              ((scalar_function_t *)local_70,return_type.physical_type_);
  }
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&bound_function->function,
            (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            local_70);
  ::std::_Function_base::~_Function_base((_Function_base *)local_70);
  bound_function->statistics = (function_statistics_t)0x0;
  LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&return_type);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  make_uniq<duckdb::DecimalArithmeticBindData>();
  pDVar2 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
           ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                         *)local_70);
  pDVar2->check_overflow = bVar1;
  *(undefined8 *)this = local_70[0]._M_unused._M_object;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> DeserializeDecimalArithmetic(Deserializer &deserializer, ScalarFunction &bound_function) {

	//	// re-change the function pointers
	auto check_overflow = deserializer.ReadProperty<bool>(100, "check_overflow");
	auto return_type = deserializer.ReadProperty<LogicalType>(101, "return_type");
	auto arguments = deserializer.ReadProperty<vector<LogicalType>>(102, "arguments");
	if (check_overflow) {
		bound_function.function = GetScalarBinaryFunction<OPOVERFLOWCHECK>(return_type.InternalType());
	} else {
		bound_function.function = GetScalarBinaryFunction<OP>(return_type.InternalType());
	}
	bound_function.statistics = nullptr; // TODO we likely dont want to do stats prop again
	bound_function.return_type = return_type;
	bound_function.arguments = arguments;

	auto bind_data = make_uniq<DecimalArithmeticBindData>();
	bind_data->check_overflow = check_overflow;
	return std::move(bind_data);
}